

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flatten.cpp
# Opt level: O1

void __thiscall wasm::Flatten::visitExpression(Flatten *this,Expression *curr)

{
  vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
  *pvVar1;
  Id IVar2;
  undefined4 uVar3;
  uintptr_t uVar4;
  pointer puVar5;
  _Hash_node_base *p_Var6;
  iterator __position;
  pointer puVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  pointer puVar15;
  iterator iVar16;
  bool bVar17;
  Index IVar18;
  Index index;
  int iVar19;
  __node_base_ptr p_Var20;
  __node_base_ptr p_Var21;
  LocalSet *pLVar22;
  __uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_> _Var23;
  Module *pMVar24;
  Expression *pEVar25;
  Type TVar26;
  Module *expression;
  Expression *pEVar27;
  _Hash_node_base *p_Var28;
  _Head_base<0UL,_wasm::Function_*,_false> _Var29;
  Expression *pEVar30;
  Expression **ppEVar31;
  mapped_type *pmVar32;
  vector<wasm::Expression*,std::allocator<wasm::Expression*>> *this_00;
  _Rb_tree_node_base *p_Var33;
  undefined4 extraout_var;
  ulong uVar34;
  Expression *expr;
  uint uVar35;
  pointer puVar36;
  Builder BVar37;
  Type type_00;
  __node_base_ptr p_Var38;
  ulong uVar39;
  _Hash_node_base *p_Var40;
  pointer puVar41;
  Type type;
  byte unaff_R15B;
  Iterator __first;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type__01;
  Iterator __last;
  undefined1 auStack_208 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> originalCatchBodies;
  Module *local_78;
  Expression *curr_local;
  Expression *prelude_1;
  iterator iStack_60;
  _Hash_node_base *local_58;
  ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
  *local_50;
  Builder local_48;
  Builder builder;
  
  prelude_1 = (Expression *)0x0;
  iStack_60._M_current = (Expression **)0x0;
  local_58 = (_Hash_node_base *)0x0;
  local_48.wasm =
       (this->
       super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
       ).
       super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
       .super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>.
       super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>.currModule;
  local_78 = (Module *)curr;
  bVar17 = Properties::isSingleConstantExpression(curr);
  if (bVar17) goto LAB_0086d4db;
  IVar2 = curr->_id;
  if (IVar2 == TupleMakeId) {
    uVar4 = curr[1].type.id;
    unaff_R15B = uVar4 == 0;
    if (!(bool)unaff_R15B) {
      uVar39 = 0;
      do {
        if (curr[1].type.id <= uVar39) goto LAB_0086d97a;
        bVar17 = Properties::isSingleConstantExpression
                           (*(Expression **)(*(long *)(curr + 1) + uVar39 * 8));
        if (!bVar17) break;
        uVar39 = uVar39 + 1;
        unaff_R15B = uVar4 == uVar39;
      } while (!(bool)unaff_R15B);
    }
  }
  pMVar24 = local_78;
  if ((IVar2 == TupleMakeId & unaff_R15B) != 0) goto LAB_0086d4db;
  local_50 = &(this->
              super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
              ).
              super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
  ;
  IVar2 = *(Id *)&(local_78->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  uVar39 = (ulong)IVar2;
  builder.wasm = local_78;
  if (uVar39 < 0x36) {
    if ((0x3000000000000eU >> (uVar39 & 0x3f) & 1) == 0) {
      if (uVar39 == 0x16) goto LAB_0086d4db;
      goto LAB_0086cc28;
    }
    type_00.id = (this->preludes)._M_h._M_bucket_count;
    p_Var38 = (this->preludes)._M_h._M_buckets[(ulong)local_78 % type_00.id];
    p_Var20 = (__node_base_ptr)0x0;
    if ((p_Var38 != (__node_base_ptr)0x0) &&
       (p_Var28 = p_Var38->_M_nxt, p_Var20 = p_Var38,
       local_78 != (Module *)p_Var38->_M_nxt[1]._M_nxt)) {
      while (p_Var38 = p_Var28, p_Var28 = p_Var38->_M_nxt, p_Var28 != (_Hash_node_base *)0x0) {
        p_Var20 = (__node_base_ptr)0x0;
        if (((ulong)p_Var28[1]._M_nxt % type_00.id != (ulong)local_78 % type_00.id) ||
           (p_Var20 = p_Var38, local_78 == (Module *)p_Var28[1]._M_nxt)) goto LAB_0086cc9f;
      }
      p_Var20 = (__node_base_ptr)0x0;
    }
LAB_0086cc9f:
    if ((p_Var20 != (__node_base_ptr)0x0) && (p_Var20->_M_nxt != (_Hash_node_base *)0x0)) {
      __assert_fail("preludes.find(curr) == preludes.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Flatten.cpp"
                    ,0x66,"void wasm::Flatten::visitExpression(Expression *)");
    }
    if (IVar2 == BlockId) {
      originalCatchBodies.
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)&((this->
                      super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                      ).
                      super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                      .
                      super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                      .
                      super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                     .currModule)->allocator;
      auStack_208 = (undefined1  [8])0x0;
      originalCatchBodies.
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      originalCatchBodies.
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar5 = (local_78->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      BVar37.wasm = local_78;
      if (puVar5 != (pointer)0x0) {
        puVar36 = (pointer)0x0;
        do {
          if (((BVar37.wasm)->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage <= puVar36) {
LAB_0086d97a:
            __assert_fail("index < usedElements",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                          ,0xbc,
                          "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                         );
          }
          _Var29._M_head_impl =
               ((BVar37.wasm)->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[(long)puVar36]._M_t.
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          uVar39 = (this->preludes)._M_h._M_bucket_count;
          uVar34 = (ulong)_Var29._M_head_impl % uVar39;
          p_Var38 = (this->preludes)._M_h._M_buckets[uVar34];
          p_Var20 = (__node_base_ptr)0x0;
          if ((p_Var38 != (__node_base_ptr)0x0) &&
             (type_00.id = (uintptr_t)p_Var38->_M_nxt, p_Var20 = p_Var38,
             p_Var28 = (_Hash_node_base *)type_00.id,
             _Var29._M_head_impl != (Function *)((_Hash_node_base *)(type_00.id + 8))->_M_nxt)) {
            while (type_00.id = (uintptr_t)p_Var28->_M_nxt,
                  (_Hash_node_base *)type_00.id != (_Hash_node_base *)0x0) {
              p_Var20 = (__node_base_ptr)0x0;
              if (((ulong)((_Hash_node_base *)(type_00.id + 8))->_M_nxt % uVar39 != uVar34) ||
                 (p_Var20 = p_Var28, p_Var28 = (_Hash_node_base *)type_00.id,
                 _Var29._M_head_impl == (Function *)((_Hash_node_base *)(type_00.id + 8))->_M_nxt))
              goto LAB_0086cd6d;
            }
            p_Var20 = (__node_base_ptr)0x0;
          }
LAB_0086cd6d:
          if (p_Var20 == (__node_base_ptr)0x0) {
            p_Var28 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var28 = p_Var20->_M_nxt;
          }
          if (p_Var28 != (_Hash_node_base *)0x0) {
            p_Var6 = p_Var28[3]._M_nxt;
            for (p_Var40 = p_Var28[2]._M_nxt; p_Var40 != p_Var6; p_Var40 = p_Var40 + 1) {
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         auStack_208,(Expression *)p_Var40->_M_nxt);
            }
            BVar37.wasm = builder.wasm;
            if (p_Var28[3]._M_nxt != p_Var28[2]._M_nxt) {
              p_Var28[3]._M_nxt = p_Var28[2]._M_nxt;
            }
          }
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                     auStack_208,(Expression *)_Var29._M_head_impl);
          puVar36 = (pointer)((long)&(puVar36->_M_t).
                                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                     .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl +
                             1);
        } while (puVar36 != puVar5);
      }
      pMVar24 = (Module *)
                ((BVar37.wasm)->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ((BVar37.wasm)->functions).
      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_208;
      puVar5 = ((BVar37.wasm)->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      puVar15 = ((BVar37.wasm)->globals).
                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ((BVar37.wasm)->functions).
      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)originalCatchBodies.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      ((BVar37.wasm)->globals).
      super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)originalCatchBodies.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
      uVar39 = ((Type *)&((BVar37.wasm)->exports).
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->id;
      auStack_208 = (undefined1  [8])pMVar24;
      originalCatchBodies.
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)puVar5;
      originalCatchBodies.
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)puVar15;
      if (1 < uVar39) {
        type_00.id = (uintptr_t)
                     ((BVar37.wasm)->functions).
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        p_Var21 = std::
                  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::_M_find_before_node
                            (&(this->breakTemps)._M_h,
                             type_00.id % (this->breakTemps)._M_h._M_bucket_count,
                             (key_type *)
                             &((BVar37.wasm)->exports).
                              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,type_00.id);
        if (p_Var21 == (__node_base_ptr)0x0) {
          p_Var28 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var28 = p_Var21->_M_nxt;
        }
        if (p_Var28 == (_Hash_node_base *)0x0) {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = uVar39;
          IVar18 = Builder::addVar((Builder *)
                                   (this->
                                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                   ).
                                   super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .
                                   super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .
                                   super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .currFunction,(Function *)0x0,(Name)(auVar11 << 0x40),type_00);
        }
        else {
          IVar18 = *(Index *)&p_Var28[3]._M_nxt;
        }
        puVar5 = ((BVar37.wasm)->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (puVar5 == (pointer)0x0) {
          __assert_fail("usedElements > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xd0,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        puVar36 = ((BVar37.wasm)->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        _Var29._M_head_impl =
             puVar36[(long)((long)&puVar5[-1]._M_t.
                                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                   .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 7)
                    ]._M_t.
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (1 < ((Type *)((long)&(_Var29._M_head_impl)->super_Importable + 8))->id) {
          _Var29._M_head_impl =
               (Function *)Builder::makeLocalSet(&local_48,IVar18,_Var29._M_head_impl);
          puVar36[(long)((long)&puVar5[-1]._M_t.
                                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 7)].
          _M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
          super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl = _Var29._M_head_impl;
        }
        Block::finalize((Block *)BVar37.wasm,(optional<wasm::Type>)(ZEXT816(1) << 0x40),Unknown);
        pEVar30 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
        pEVar30->_id = LocalGetId;
        *(Index *)(pEVar30 + 1) = IVar18;
        (pEVar30->type).id = uVar39;
        Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                  ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)
                   local_50,pEVar30);
        ppEVar31 = SmallVector<wasm::Expression_*,_10UL>::back
                             (&(this->
                               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                               ).
                               super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               .expressionStack);
        BVar37 = builder;
        *ppEVar31 = pEVar30;
        curr_local = (Expression *)builder.wasm;
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&prelude_1,
                   &curr_local);
      }
      Block::finalize((Block *)BVar37.wasm,(optional<wasm::Type>)(ZEXT816(1) << 0x40),Unknown);
    }
    else {
      if (local_78 == (Module *)0x0 || IVar2 != IfId) {
        if (local_78 == (Module *)0x0 || IVar2 != LoopId) {
          if ((local_78 == (Module *)0x0) || (IVar2 != TryId)) {
            handle_unreachable("unexpected expr type",
                               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Flatten.cpp"
                               ,0xe7);
          }
          pEVar30 = (Expression *)
                    (local_78->functions).
                    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pvVar1 = &local_78->tags;
          type_00.id = (uintptr_t)
                       (local_78->tags).
                       super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          __first.index = 0;
          __first.parent = (ArenaVector<wasm::Expression_*> *)pvVar1;
          __last.index = type_00.id;
          __last.parent = (ArenaVector<wasm::Expression_*> *)pvVar1;
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          vector<ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::Iterator,void>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_208,
                     __first,__last,(allocator_type *)&curr_local);
          uVar39 = ((Type *)&(pMVar24->exports).
                             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->id;
          if (1 < uVar39) {
            auVar8._8_8_ = 0;
            auVar8._0_8_ = uVar39;
            IVar18 = Builder::addVar((Builder *)
                                     (this->
                                     super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                     ).
                                     super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     .
                                     super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     .
                                     super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     .currFunction,(Function *)0x0,(Name)(auVar8 << 0x40),type_00);
            pEVar25 = (Expression *)
                      ((builder.wasm)->functions).
                      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (1 < (pEVar25->type).id) {
              pLVar22 = Builder::makeLocalSet(&local_48,IVar18,pEVar25);
              ((builder.wasm)->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)pLVar22;
            }
            if (((builder.wasm)->tags).
                super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
              uVar35 = 1;
              puVar41 = (pointer)0x0;
              do {
                _Var23._M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl =
                     (pvVar1->
                     super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[(long)puVar41]._M_t.
                     super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t;
                if (1 < ((Type *)((long)_Var23._M_t.
                                        super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>
                                        .super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 8)
                        )->id) {
                  _Var23._M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                  super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl =
                       (tuple<wasm::Tag_*,_std::default_delete<wasm::Tag>_>)
                       Builder::makeLocalSet
                                 (&local_48,IVar18,
                                  (Expression *)
                                  _Var23._M_t.
                                  super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>
                                  .super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl);
                  if (((builder.wasm)->tags).
                      super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish <= puVar41) goto LAB_0086d97a;
                  (pvVar1->
                  super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[(long)puVar41]._M_t.
                  super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t =
                       _Var23._M_t.
                       super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                       super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
                }
                puVar41 = (pointer)(ulong)uVar35;
                uVar35 = uVar35 + 1;
              } while (puVar41 < ((builder.wasm)->tags).
                                 super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
            }
            pMVar24 = (Module *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
            *(Id *)&(pMVar24->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = LocalGetId;
            *(Index *)&(pMVar24->exports).
                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage = IVar18;
            ((Type *)&(pMVar24->exports).
                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->id = uVar39;
            curr_local = (Expression *)builder.wasm;
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&prelude_1,
                       &curr_local);
          }
          BVar37.wasm = builder.wasm;
          pEVar25 = getPreludesWithExpression
                              (this,pEVar30,
                               (Expression *)
                               ((builder.wasm)->functions).
                               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
          ((BVar37.wasm)->functions).
          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pEVar25;
          if (((BVar37.wasm)->tags).
              super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
            uVar35 = 1;
            puVar41 = (pointer)0x0;
            do {
              pEVar30 = (Expression *)
                        (&(((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                             *)auStack_208)->
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)[(long)puVar41];
              _Var23._M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
              super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl =
                   (tuple<wasm::Tag_*,_std::default_delete<wasm::Tag>_>)
                   getPreludesWithExpression
                             (this,pEVar30,
                              (Expression *)
                              (pvVar1->
                              super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[(long)puVar41]._M_t.
                              super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t
                             );
              if (((builder.wasm)->tags).
                  super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish <= puVar41) goto LAB_0086d97a;
              ((builder.wasm)->tags).
              super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)puVar41]._M_t.
              super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t =
                   _Var23._M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                   super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
              puVar41 = (pointer)(ulong)uVar35;
              uVar35 = uVar35 + 1;
            } while (puVar41 < ((builder.wasm)->tags).
                               super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
          }
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pEVar30;
          Try::finalize((Try *)builder.wasm,type_);
          Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
          replaceCurrent((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                          *)local_50,(Expression *)pMVar24);
          ppEVar31 = SmallVector<wasm::Expression_*,_10UL>::back
                               (&(this->
                                 super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                 ).
                                 super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 .expressionStack);
          *ppEVar31 = (Expression *)pMVar24;
          if (auStack_208 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_208,
                            (long)originalCatchBodies.
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_208);
          }
          goto LAB_0086d351;
        }
        uVar39 = ((Type *)&(local_78->exports).
                           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->id;
        BVar37.wasm = (Module *)
                      (local_78->functions).
                      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        expression = local_78;
        if (1 < uVar39) {
          auVar9._8_8_ = 0;
          auVar9._0_8_ = uVar39;
          builder.wasm = BVar37.wasm;
          IVar18 = Builder::addVar((Builder *)
                                   (this->
                                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                   ).
                                   super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .
                                   super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .
                                   super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .currFunction,(Function *)0x0,(Name)(auVar9 << 0x40),type_00);
          pLVar22 = Builder::makeLocalSet
                              (&local_48,IVar18,
                               (Expression *)
                               (pMVar24->functions).
                               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
          (pMVar24->functions).
          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pLVar22;
          expression = (Module *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
          *(Id *)&(expression->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = LocalGetId;
          *(Index *)&(expression->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage = IVar18;
          ((Type *)&(expression->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->id = uVar39;
          auStack_208 = (undefined1  [8])pMVar24;
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&prelude_1,
                     (Expression **)auStack_208);
          ((Type *)&(pMVar24->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->id = 0;
          BVar37 = builder;
        }
        pEVar30 = getPreludesWithExpression
                            (this,(Expression *)BVar37.wasm,
                             (Expression *)
                             (pMVar24->functions).
                             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        (pMVar24->functions).
        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)pEVar30;
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload._M_value.id = (Type)(Type)BVar37.wasm;
        Loop::finalize((Loop *)pMVar24,type__00);
        Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                  ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)
                   local_50,(Expression *)expression);
      }
      else {
        expression = (Module *)
                     getPreludesWithExpression
                               (this,(Expression *)
                                     (local_78->exports).
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (Expression *)local_78);
        pEVar30 = (Expression *)
                  (pMVar24->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pEVar25 = (Expression *)
                  (pMVar24->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pEVar25 == (Expression *)0x0) {
          TVar26.id = 0;
        }
        else {
          TVar26 = wasm::Type::getLeastUpperBound((pEVar30->type).id,(pEVar25->type).id);
        }
        auStack_208 = (undefined1  [8])0x0;
        if (1 < TVar26.id) {
          auVar10._8_8_ = 0;
          auVar10._0_8_ = TVar26.id;
          IVar18 = Builder::addVar((Builder *)
                                   (this->
                                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                   ).
                                   super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .
                                   super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .
                                   super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .currFunction,(Function *)0x0,(Name)(auVar10 << 0x40),type_00);
          pEVar27 = (Expression *)
                    ((builder.wasm)->functions).
                    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (1 < (pEVar27->type).id) {
            pLVar22 = Builder::makeLocalSet(&local_48,IVar18,pEVar27);
            ((builder.wasm)->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pLVar22;
          }
          pEVar27 = (Expression *)
                    ((builder.wasm)->functions).
                    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (1 < (pEVar27->type).id) {
            pLVar22 = Builder::makeLocalSet(&local_48,IVar18,pEVar27);
            ((builder.wasm)->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)pLVar22;
          }
          if (1 < ((Type *)&(local_78->exports).
                            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->id) {
            auStack_208 = (undefined1  [8])expression;
            expression = (Module *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
            *(Id *)&(expression->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = LocalGetId;
            *(Index *)&(expression->exports).
                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage = IVar18;
            ((Type *)&(expression->exports).
                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->id = TVar26.id;
          }
        }
        BVar37.wasm = builder.wasm;
        pEVar27 = getPreludesWithExpression
                            (this,pEVar30,
                             (Expression *)
                             ((builder.wasm)->functions).
                             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
        ((BVar37.wasm)->functions).
        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pEVar27;
        pEVar27 = (Expression *)
                  ((BVar37.wasm)->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pEVar27 != (Expression *)0x0) {
          pEVar30 = getPreludesWithExpression(this,pEVar25,pEVar27);
          ((BVar37.wasm)->functions).
          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pEVar30;
          pEVar30 = pEVar25;
        }
        type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pEVar30;
        If::finalize((If *)BVar37.wasm,type__01);
        if (auStack_208 != (undefined1  [8])0x0) {
          Visitor<wasm::ReFinalizeNode,_void>::visit
                    ((Visitor<wasm::ReFinalizeNode,_void> *)&curr_local,(Expression *)auStack_208);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&prelude_1,
                     (value_type *)auStack_208);
        }
        Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                  ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)
                   local_50,(Expression *)expression);
      }
      ppEVar31 = SmallVector<wasm::Expression_*,_10UL>::back
                           (&(this->
                             super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                             ).
                             super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                             .expressionStack);
      *ppEVar31 = (Expression *)expression;
    }
  }
  else {
LAB_0086cc28:
    type_00.id = (this->preludes)._M_h._M_bucket_count;
    p_Var38 = (this->preludes)._M_h._M_buckets[(ulong)local_78 % type_00.id];
    p_Var20 = (__node_base_ptr)0x0;
    if ((p_Var38 != (__node_base_ptr)0x0) &&
       (p_Var28 = p_Var38->_M_nxt, p_Var20 = p_Var38,
       local_78 != (Module *)p_Var38->_M_nxt[1]._M_nxt)) {
      while (p_Var38 = p_Var28, p_Var28 = p_Var38->_M_nxt, p_Var28 != (_Hash_node_base *)0x0) {
        p_Var20 = (__node_base_ptr)0x0;
        if (((ulong)p_Var28[1]._M_nxt % type_00.id != (ulong)local_78 % type_00.id) ||
           (p_Var20 = p_Var38, local_78 == (Module *)p_Var28[1]._M_nxt)) goto LAB_0086d564;
      }
      p_Var20 = (__node_base_ptr)0x0;
    }
LAB_0086d564:
    if (p_Var20 == (__node_base_ptr)0x0) {
      p_Var28 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var28 = p_Var20->_M_nxt;
    }
    if (p_Var28 != (_Hash_node_base *)0x0) {
      pEVar30 = (Expression *)p_Var28[2]._M_nxt;
      pEVar25 = (Expression *)p_Var28[3]._M_nxt;
      p_Var40 = p_Var28[4]._M_nxt;
      p_Var28[2]._M_nxt = (_Hash_node_base *)prelude_1;
      p_Var28[3]._M_nxt = (_Hash_node_base *)iStack_60._M_current;
      p_Var28[4]._M_nxt = local_58;
      prelude_1 = pEVar30;
      iStack_60._M_current = (Expression **)pEVar25;
      local_58 = p_Var40;
    }
    if (local_78 == (Module *)0x0 || IVar2 != LocalSetId) {
      if (local_78 == (Module *)0x0 || IVar2 != BreakId) {
        if ((local_78 != (Module *)0x0 && IVar2 == SwitchId) &&
           (pEVar30 = (Expression *)
                      (local_78->globals).
                      super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
           pEVar30 != (Expression *)0x0)) {
          TVar26.id = (pEVar30->type).id;
          if (TVar26.id < 2) {
            if (TVar26.id != 1) {
              __assert_fail("type == Type::unreachable",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Flatten.cpp"
                            ,0x148,"void wasm::Flatten::visitExpression(Expression *)");
            }
            Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
            replaceCurrent((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                            *)local_50,pEVar30);
LAB_0086d8fa:
            ppEVar31 = SmallVector<wasm::Expression_*,_10UL>::back
                                 (&(this->
                                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                   ).
                                   super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .expressionStack);
            *ppEVar31 = pEVar30;
          }
          else {
            auVar13._8_8_ = 0;
            auVar13._0_8_ = TVar26.id;
            IVar18 = Builder::addVar((Builder *)
                                     (this->
                                     super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                     ).
                                     super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     .
                                     super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     .
                                     super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     .currFunction,(Function *)0x0,(Name)(auVar13 << 0x40),type_00);
            BVar37 = builder;
            auStack_208 = (undefined1  [8])
                          Builder::makeLocalSet
                                    (&local_48,IVar18,
                                     (Expression *)
                                     ((builder.wasm)->globals).
                                     super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&prelude_1,
                       (Expression **)auStack_208);
            BranchUtils::getUniqueTargets((NameSet *)auStack_208,(BranchUtils *)BVar37.wasm,expr);
            for (p_Var33 = (_Rb_tree_node_base *)
                           originalCatchBodies.
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                p_Var33 != (_Rb_tree_node_base *)&originalCatchBodies;
                p_Var33 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var33)) {
              index = getTempForBreakTarget(this,(Name)*(string_view *)(p_Var33 + 1),TVar26);
              pEVar30 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
              pEVar30->_id = LocalGetId;
              *(Index *)(pEVar30 + 1) = IVar18;
              (pEVar30->type).id = TVar26.id;
              curr_local = (Expression *)Builder::makeLocalSet(&local_48,index,pEVar30);
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              emplace_back<wasm::Expression*>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&prelude_1,
                         &curr_local);
            }
            ((builder.wasm)->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            Switch::finalize((Switch *)builder.wasm);
            std::
            _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
            ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                         *)auStack_208);
          }
        }
      }
      else {
        pEVar30 = (Expression *)
                  (local_78->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pEVar30 != (Expression *)0x0) {
          uVar39 = (pEVar30->type).id;
          if (uVar39 < 2) {
            if (uVar39 != 1) {
              __assert_fail("type == Type::unreachable",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Flatten.cpp"
                            ,0x131,"void wasm::Flatten::visitExpression(Expression *)");
            }
            Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
            replaceCurrent((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                            *)local_50,pEVar30);
            goto LAB_0086d8fa;
          }
          pEVar30 = ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                    ::findBreakTarget(local_50,(IString)*(IString *)
                                                         &(local_78->exports).
                                                                                                                    
                                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                     );
          TVar26.id = (pEVar30->type).id;
          IVar18 = getTempForBreakTarget
                             (this,(IString)*(IString *)
                                             &(pMVar24->exports).
                                              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              TVar26);
          auStack_208 = (undefined1  [8])
                        Builder::makeLocalSet
                                  (&local_48,IVar18,
                                   (Expression *)
                                   ((builder.wasm)->functions).
                                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&prelude_1,
                     (Expression **)auStack_208);
          if (uVar39 != TVar26.id) {
            auVar14._8_8_ = 0;
            auVar14._0_8_ = uVar39;
            IVar18 = Builder::addVar((Builder *)
                                     (this->
                                     super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                     ).
                                     super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     .
                                     super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     .
                                     super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     .currFunction,(Function *)0x0,(Name)(auVar14 << 0x40),type_00);
            iVar19 = ExpressionManipulator::copy
                               ((EVP_PKEY_CTX *)
                                ((builder.wasm)->functions).
                                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                                (EVP_PKEY_CTX *)
                                (this->
                                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                ).
                                super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                .
                                super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                .
                                super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                .currModule);
            auStack_208 = (undefined1  [8])
                          Builder::makeLocalSet
                                    (&local_48,IVar18,(Expression *)CONCAT44(extraout_var,iVar19));
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&prelude_1,
                       (Expression **)auStack_208);
          }
          BVar37.wasm = builder.wasm;
          if (((builder.wasm)->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            auStack_208 = (undefined1  [8])builder.wasm;
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&prelude_1,
                       (Expression **)auStack_208);
            puVar7 = ((BVar37.wasm)->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (puVar7 < (pointer)0x2) {
              if (puVar7 != (pointer)0x1) {
                __assert_fail("br->type == Type::unreachable",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Flatten.cpp"
                              ,0x12a,"void wasm::Flatten::visitExpression(Expression *)");
              }
              pEVar30 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x10,8);
              pEVar30->_id = UnreachableId;
              (pEVar30->type).id = 1;
              Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
              replaceCurrent((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                              *)local_50,pEVar30);
            }
            else {
              pEVar30 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
              pEVar30->_id = LocalGetId;
              *(Index *)(pEVar30 + 1) = IVar18;
              (pEVar30->type).id = uVar39;
              Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
              replaceCurrent((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                              *)local_50,pEVar30);
            }
            ppEVar31 = SmallVector<wasm::Expression_*,_10UL>::back
                                 (&(this->
                                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                   ).
                                   super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .expressionStack);
            *ppEVar31 = pEVar30;
          }
          ((builder.wasm)->functions).
          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          Break::finalize((Break *)builder.wasm);
        }
      }
    }
    else {
      bVar17 = LocalSet::isTee((LocalSet *)local_78);
      BVar37 = builder;
      if (bVar17) {
        pEVar30 = (Expression *)
                  ((builder.wasm)->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((pEVar30->type).id == 1) {
          Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
          replaceCurrent((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                          *)local_50,pEVar30);
          goto LAB_0086d8fa;
        }
        LocalSet::makeSet((LocalSet *)builder.wasm);
        auStack_208 = (undefined1  [8])BVar37.wasm;
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&prelude_1,
                   (Expression **)auStack_208);
        TVar26 = Function::getLocalType
                           ((this->
                            super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                            ).
                            super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                            .
                            super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                            .
                            super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                            .currFunction,
                            *(Index *)&((BVar37.wasm)->exports).
                                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        uVar3 = *(undefined4 *)
                 &((BVar37.wasm)->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pEVar30 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
        pEVar30->_id = LocalGetId;
        *(undefined4 *)(pEVar30 + 1) = uVar3;
        (pEVar30->type).id = TVar26.id;
        Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                  ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)
                   local_50,pEVar30);
        ppEVar31 = SmallVector<wasm::Expression_*,_10UL>::back
                             (&(this->
                               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                               ).
                               super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               .expressionStack);
        *ppEVar31 = pEVar30;
      }
    }
  }
LAB_0086d351:
  IVar2 = *(Id *)&(local_78->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  if ((IVar2 == BrOnId) || (IVar2 == TryTableId)) {
    Fatal::Fatal((Fatal *)auStack_208);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &originalCatchBodies.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish,"Unsupported instruction for Flatten: ",0x25);
    curr_local = (Expression *)getExpressionName((Expression *)local_78);
    Fatal::operator<<((Fatal *)auStack_208,(char **)&curr_local);
    Fatal::~Fatal((Fatal *)auStack_208);
  }
  local_78 = (Module *)
             *(local_50->
              super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>)
              .super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>.
              replacep;
  Visitor<wasm::ReFinalizeNode,_void>::visit
            ((Visitor<wasm::ReFinalizeNode,_void> *)auStack_208,(Expression *)local_78);
  uVar39 = ((Type *)&(local_78->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->id;
  if (uVar39 != 0) {
    if (uVar39 == 1) {
      if ((_Hash_node_base *)iStack_60._M_current == local_58) {
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        _M_realloc_insert<wasm::Expression*const&>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&prelude_1,
                   iStack_60,(Expression **)&local_78);
      }
      else {
        *iStack_60._M_current = (Expression *)local_78;
        iStack_60._M_current = iStack_60._M_current + 1;
      }
      pEVar30 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x10,8);
      pEVar30->_id = UnreachableId;
      (pEVar30->type).id = 1;
      Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)
                 local_50,pEVar30);
    }
    else {
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar39;
      IVar18 = Builder::addVar((Builder *)
                               (this->
                               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                               ).
                               super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               .
                               super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               .
                               super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               .currFunction,(Function *)0x0,(Name)(auVar12 << 0x40),type_00);
      auStack_208 = (undefined1  [8])Builder::makeLocalSet(&local_48,IVar18,(Expression *)local_78);
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&prelude_1,
                 (Expression **)auStack_208);
      pEVar30 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
      pEVar30->_id = LocalGetId;
      *(Index *)(pEVar30 + 1) = IVar18;
      (pEVar30->type).id = uVar39;
      Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)
                 local_50,pEVar30);
    }
    ppEVar31 = SmallVector<wasm::Expression_*,_10UL>::back
                         (&(this->
                           super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                           ).
                           super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                           .expressionStack);
    *ppEVar31 = pEVar30;
  }
  if (prelude_1 != (Expression *)iStack_60._M_current) {
    auStack_208 = (undefined1  [8])
                  ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                  ::getParent(local_50);
    if ((auStack_208 == (undefined1  [8])0x0) ||
       ((uVar39 = (ulong)*(Id *)&(((Module *)auStack_208)->exports).
                                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start, uVar39 < 0x36 &&
        ((0x3000000000000eU >> (uVar39 & 0x3f) & 1) != 0)))) {
      curr_local = *(this->
                    super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                    ).
                    super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                    .
                    super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                    .
                    super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                    .replacep;
      pmVar32 = std::__detail::
                _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->preludes,&curr_local);
      p_Var28 = (_Hash_node_base *)
                (pmVar32->
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
                .super__Vector_impl_data._M_end_of_storage;
      pEVar30 = (Expression *)
                (pmVar32->
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
                .super__Vector_impl_data._M_start;
      pEVar25 = (Expression *)
                (pmVar32->
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
                .super__Vector_impl_data._M_finish;
      (pmVar32->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
      .super__Vector_impl_data._M_start = (pointer)prelude_1;
      (pmVar32->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
      .super__Vector_impl_data._M_finish = iStack_60._M_current;
      (pmVar32->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)local_58;
      prelude_1 = pEVar30;
      iStack_60._M_current = (Expression **)pEVar25;
      local_58 = p_Var28;
    }
    else {
      this_00 = (vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                std::__detail::
                _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->preludes,(key_type *)auStack_208);
      iVar16._M_current = iStack_60._M_current;
      if (prelude_1 != (Expression *)iStack_60._M_current) {
        pEVar30 = prelude_1;
        do {
          curr_local = *(Expression **)pEVar30;
          __position._M_current = *(Expression ***)(this_00 + 8);
          if (__position._M_current == *(Expression ***)(this_00 + 0x10)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>(this_00,__position,&curr_local);
          }
          else {
            *__position._M_current = curr_local;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          }
          pEVar30 = (Expression *)&pEVar30->type;
        } while (pEVar30 != (Expression *)iVar16._M_current);
      }
    }
  }
LAB_0086d4db:
  if (prelude_1 != (Expression *)0x0) {
    operator_delete(prelude_1,(long)local_58 - (long)prelude_1);
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    std::vector<Expression*> ourPreludes;
    Builder builder(*getModule());

    // Nothing to do for constants and nop.
    if (Properties::isConstantExpression(curr) || curr->is<Nop>()) {
      return;
    }

    if (Properties::isControlFlowStructure(curr)) {
      // handle control flow explicitly. our children do not have control flow,
      // but they do have preludes which we need to set up in the right place

      // no one should have given us preludes, they are on the children
      assert(preludes.find(curr) == preludes.end());

      if (auto* block = curr->dynCast<Block>()) {
        // make a new list, where each item's preludes are added before it
        ExpressionList newList(getModule()->allocator);
        for (auto* item : block->list) {
          auto iter = preludes.find(item);
          if (iter != preludes.end()) {
            auto& itemPreludes = iter->second;
            for (auto* prelude : itemPreludes) {
              newList.push_back(prelude);
            }
            itemPreludes.clear();
          }
          newList.push_back(item);
        }
        block->list.swap(newList);
        // remove a block return value
        auto type = block->type;
        if (type.isConcrete()) {
          // if there is a temp index for breaking to the block, use that
          Index temp;
          auto iter = breakTemps.find(block->name);
          if (iter != breakTemps.end()) {
            temp = iter->second;
          } else {
            temp = builder.addVar(getFunction(), type);
          }
          auto*& last = block->list.back();
          if (last->type.isConcrete()) {
            last = builder.makeLocalSet(temp, last);
          }
          block->finalize(Type::none);
          // and we leave just a get of the value
          auto* rep = builder.makeLocalGet(temp, type);
          replaceCurrent(rep);
          // the whole block is now a prelude
          ourPreludes.push_back(block);
        }
        // the block now has no return value, and may have become unreachable
        block->finalize(Type::none);

      } else if (auto* iff = curr->dynCast<If>()) {
        // condition preludes go before the entire if
        auto* rep = getPreludesWithExpression(iff->condition, iff);
        // arm preludes go in the arms. we must also remove an if value
        auto* originalIfTrue = iff->ifTrue;
        auto* originalIfFalse = iff->ifFalse;
        auto type = iff->ifFalse ? Type::getLeastUpperBound(iff->ifTrue->type,
                                                            iff->ifFalse->type)
                                 : Type::none;
        Expression* prelude = nullptr;
        if (type.isConcrete()) {
          Index temp = builder.addVar(getFunction(), type);
          if (iff->ifTrue->type.isConcrete()) {
            iff->ifTrue = builder.makeLocalSet(temp, iff->ifTrue);
          }
          if (iff->ifFalse->type.isConcrete()) {
            iff->ifFalse = builder.makeLocalSet(temp, iff->ifFalse);
          }
          if (curr->type.isConcrete()) {
            // the whole if (+any preludes from the condition) is now a prelude
            prelude = rep;
            // and we leave just a get of the value
            rep = builder.makeLocalGet(temp, type);
          }
        }
        iff->ifTrue = getPreludesWithExpression(originalIfTrue, iff->ifTrue);
        if (iff->ifFalse) {
          iff->ifFalse =
            getPreludesWithExpression(originalIfFalse, iff->ifFalse);
        }
        iff->finalize();
        if (prelude) {
          ReFinalizeNode().visit(prelude);
          ourPreludes.push_back(prelude);
        }
        replaceCurrent(rep);

      } else if (auto* loop = curr->dynCast<Loop>()) {
        // remove a loop value
        Expression* rep = loop;
        auto* originalBody = loop->body;
        auto type = loop->type;
        if (type.isConcrete()) {
          Index temp = builder.addVar(getFunction(), type);
          loop->body = builder.makeLocalSet(temp, loop->body);
          // and we leave just a get of the value
          rep = builder.makeLocalGet(temp, type);
          // the whole if is now a prelude
          ourPreludes.push_back(loop);
          loop->type = Type::none;
        }
        loop->body = getPreludesWithExpression(originalBody, loop->body);
        loop->finalize();
        replaceCurrent(rep);

      } else if (auto* tryy = curr->dynCast<Try>()) {
        // remove a try value
        Expression* rep = tryy;
        auto* originalBody = tryy->body;
        std::vector<Expression*> originalCatchBodies(tryy->catchBodies.begin(),
                                                     tryy->catchBodies.end());
        auto type = tryy->type;
        if (type.isConcrete()) {
          Index temp = builder.addVar(getFunction(), type);
          if (tryy->body->type.isConcrete()) {
            tryy->body = builder.makeLocalSet(temp, tryy->body);
          }
          for (Index i = 0; i < tryy->catchBodies.size(); i++) {
            if (tryy->catchBodies[i]->type.isConcrete()) {
              tryy->catchBodies[i] =
                builder.makeLocalSet(temp, tryy->catchBodies[i]);
            }
          }
          // and we leave just a get of the value
          rep = builder.makeLocalGet(temp, type);
          // the whole try is now a prelude
          ourPreludes.push_back(tryy);
        }
        tryy->body = getPreludesWithExpression(originalBody, tryy->body);
        for (Index i = 0; i < tryy->catchBodies.size(); i++) {
          tryy->catchBodies[i] = getPreludesWithExpression(
            originalCatchBodies[i], tryy->catchBodies[i]);
        }
        tryy->finalize();
        replaceCurrent(rep);

      } else {
        WASM_UNREACHABLE("unexpected expr type");
      }

    } else {
      // for anything else, there may be existing preludes
      auto iter = preludes.find(curr);
      if (iter != preludes.end()) {
        ourPreludes.swap(iter->second);
      }

      // special handling
      if (auto* set = curr->dynCast<LocalSet>()) {
        if (set->isTee()) {
          // we disallow local.tee
          if (set->value->type == Type::unreachable) {
            replaceCurrent(set->value); // trivial, no set happens
          } else {
            // use a set in a prelude + a get
            set->makeSet();
            ourPreludes.push_back(set);
            Type localType = getFunction()->getLocalType(set->index);
            replaceCurrent(builder.makeLocalGet(set->index, localType));
          }
        }

      } else if (auto* br = curr->dynCast<Break>()) {
        if (br->value) {
          auto type = br->value->type;
          if (type.isConcrete()) {
            // we are sending a value. use a local instead
            Type blockType = findBreakTarget(br->name)->type;
            Index temp = getTempForBreakTarget(br->name, blockType);
            ourPreludes.push_back(builder.makeLocalSet(temp, br->value));

            // br_if leaves a value on the stack if not taken, which later can
            // be the last element of the enclosing innermost block and flow
            // out. The local we created using 'getTempForBreakTarget' returns
            // the return type of the block this branch is targetting, which may
            // not be the same with the innermost block's return type. For
            // example,
            // (block $any (result anyref)
            //   (block (result funcref)
            //     (local.tee $0
            //       (br_if $any
            //         (ref.null func)
            //         (i32.const 0)
            //       )
            //     )
            //   )
            // )
            // In this case we need two locals to store (ref.null); one with
            // funcref type that's for the target block ($label0) and one more
            // with anyref type in case for flowing out. Here we create the
            // second 'flowing out' local in case two block's types are
            // different.
            if (type != blockType) {
              temp = builder.addVar(getFunction(), type);
              ourPreludes.push_back(builder.makeLocalSet(
                temp, ExpressionManipulator::copy(br->value, *getModule())));
            }

            if (br->condition) {
              // the value must also flow out
              ourPreludes.push_back(br);
              if (br->type.isConcrete()) {
                replaceCurrent(builder.makeLocalGet(temp, type));
              } else {
                assert(br->type == Type::unreachable);
                replaceCurrent(builder.makeUnreachable());
              }
            }
            br->value = nullptr;
            br->finalize();
          } else {
            assert(type == Type::unreachable);
            // we don't need the br at all
            replaceCurrent(br->value);
          }
        }

      } else if (auto* sw = curr->dynCast<Switch>()) {
        if (sw->value) {
          auto type = sw->value->type;
          if (type.isConcrete()) {
            // we are sending a value. use a local instead
            Index temp = builder.addVar(getFunction(), type);
            ourPreludes.push_back(builder.makeLocalSet(temp, sw->value));
            // we don't know which break target will be hit - assign to them all
            auto names = BranchUtils::getUniqueTargets(sw);
            for (auto name : names) {
              ourPreludes.push_back(
                builder.makeLocalSet(getTempForBreakTarget(name, type),
                                     builder.makeLocalGet(temp, type)));
            }
            sw->value = nullptr;
            sw->finalize();
          } else {
            assert(type == Type::unreachable);
            // we don't need the br at all
            replaceCurrent(sw->value);
          }
        }
      }
    }

    if (curr->is<BrOn>() || curr->is<TryTable>()) {
      Fatal() << "Unsupported instruction for Flatten: "
              << getExpressionName(curr);
    }

    // continue for general handling of everything, control flow or otherwise
    curr = getCurrent(); // we may have replaced it
    // we have changed children
    ReFinalizeNode().visit(curr);
    if (curr->type == Type::unreachable) {
      ourPreludes.push_back(curr);
      replaceCurrent(builder.makeUnreachable());
    } else if (curr->type.isConcrete()) {
      // use a local
      auto type = curr->type;
      Index temp = builder.addVar(getFunction(), type);
      ourPreludes.push_back(builder.makeLocalSet(temp, curr));
      replaceCurrent(builder.makeLocalGet(temp, type));
    }

    // next, finish up: migrate our preludes if we can
    if (!ourPreludes.empty()) {
      auto* parent = getParent();
      if (parent && !Properties::isControlFlowStructure(parent)) {
        auto& parentPreludes = preludes[parent];
        for (auto* prelude : ourPreludes) {
          parentPreludes.push_back(prelude);
        }
      } else {
        // keep our preludes, parent will handle them
        preludes[getCurrent()].swap(ourPreludes);
      }
    }
  }